

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::~UploadWaitDrawCase
          (UploadWaitDrawCase *this)

{
  UploadWaitDrawCase *this_local;
  
  ~UploadWaitDrawCase(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

UploadWaitDrawCase::~UploadWaitDrawCase (void)
{
	deinit();
}